

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  pointer pCVar1;
  pointer pCVar2;
  Amount *value_00;
  _func_int **__dest;
  CfdException *pCVar3;
  pointer rangeproof;
  pointer nonce_00;
  pointer surjectionproof;
  ulong uVar4;
  size_t __n;
  uchar *puVar5;
  unsigned_long local_218;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  ConfidentialNonce *local_178;
  ByteData *local_170;
  Amount *local_168;
  ConfidentialAssetId *local_160;
  Script *local_158;
  ConfidentialValue confidential_value;
  ConfidentialTxOut out;
  
  if ((long)(this->vout_).
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vout_).
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ._M_impl.super__Vector_impl_data._M_start == 0xf7ffffff08) {
    out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
    out.super_AbstractTxOut.value_.amount_ =
         CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x88f);
    out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
    logger::log<>((CfdSourceLocation *)&out,kCfdLogLevelWarning,"vout maximum.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    out.super_AbstractTxOut._vptr_AbstractTxOut =
         (_func_int **)&out.super_AbstractTxOut.value_.ignore_check_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&out,"vout maximum.","");
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&out);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialValue::ConfidentialValue(&confidential_value,value);
  local_158 = locking_script;
  Script::GetData((ByteData *)&out,locking_script);
  ByteData::GetBytes(&local_190,(ByteData *)&out);
  if (out.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
    operator_delete(out.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  ConfidentialAssetId::GetData((ByteData *)&out,asset);
  ByteData::GetBytes(&local_1a8,(ByteData *)&out);
  local_160 = asset;
  if (out.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
    operator_delete(out.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x0;
  out.super_AbstractTxOut.value_.amount_ = 0;
  out.super_AbstractTxOut.value_.ignore_check_ = false;
  out.super_AbstractTxOut.value_._9_7_ = 0;
  uVar4 = (long)confidential_value.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)confidential_value.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    __dest = (_func_int **)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      ::std::__throw_bad_alloc();
    }
    __dest = (_func_int **)operator_new(uVar4);
  }
  out.super_AbstractTxOut.value_._8_8_ = uVar4 + (long)__dest;
  __n = (long)confidential_value.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)confidential_value.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  out.super_AbstractTxOut._vptr_AbstractTxOut = __dest;
  if (__n != 0) {
    out.super_AbstractTxOut.value_.amount_ = (int64_t)__dest;
    memmove(__dest,confidential_value.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
  out.super_AbstractTxOut.value_.amount_ = (long)__dest + __n;
  ByteData::GetBytes(&local_1c0,(ByteData *)&out);
  if (out.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
    operator_delete(out.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out,&(nonce->data_).data_);
  ByteData::GetBytes(&local_1d8,(ByteData *)&out);
  if (out.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)0x0) {
    operator_delete(out.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  ByteData::GetBytes(&local_1f0,surjection_proof);
  local_178 = nonce;
  local_170 = surjection_proof;
  local_168 = value;
  ByteData::GetBytes(&local_208,range_proof);
  puVar5 = (uchar *)0x0;
  nonce_00 = local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    nonce_00 = puVar5;
  }
  surjectionproof =
       local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    surjectionproof = puVar5;
  }
  rangeproof = local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  if ((long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    rangeproof = puVar5;
  }
  ret = wally_tx_add_elements_raw_output
                  ((wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_,
                   local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                   local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                   local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,nonce_00,
                   (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,surjectionproof,
                   (long)local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,rangeproof,
                   (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,0);
  value_00 = local_168;
  if (ret == 0) {
    ConfidentialTxOut::ConfidentialTxOut
              (&out,local_158,local_160,&confidential_value,local_178,local_170,range_proof);
    ConfidentialTxOut::SetValue(&out,value_00);
    ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    push_back(&this->vout_,&out);
    pCVar1 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ConfidentialTxOut::~ConfidentialTxOut(&out);
    if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    confidential_value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (confidential_value.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(confidential_value.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return (int)((ulong)((long)pCVar2 - (long)pCVar1) >> 3) * -0x42108421 - 1;
  }
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8a8);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  logger::log<int&>((CfdSourceLocation *)&out,kCfdLogLevelWarning,
                    "wally_tx_add_elements_raw_output NG[{}].",&ret);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8a9);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  local_218 = (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&out,kCfdLogLevelWarning,"script_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8aa);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  local_218 = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&out,kCfdLogLevelWarning,"asset_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8ab);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  local_218 = (long)local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&out,kCfdLogLevelWarning,"value_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8ac);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  local_218 = (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&out,kCfdLogLevelWarning,"nonce_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8ad);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  local_218 = (long)local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&out,kCfdLogLevelWarning,"surjection_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x59e1e8;
  out.super_AbstractTxOut.value_.amount_ =
       CONCAT44(out.super_AbstractTxOut.value_.amount_._4_4_,0x8ae);
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_a2cf55;
  local_218 = (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&out,kCfdLogLevelWarning,"range_data.size[{}].",&local_218);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  out.super_AbstractTxOut._vptr_AbstractTxOut =
       (_func_int **)&out.super_AbstractTxOut.value_.ignore_check_;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&out,"vout add error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&out);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script, const ConfidentialNonce &nonce,
    const ByteData &surjection_proof, const ByteData &range_proof) {
  if (vout_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vout maximum.");
    throw CfdException(kCfdIllegalStateError, "vout maximum.");
  }

  ConfidentialValue confidential_value = ConfidentialValue(value);
  const std::vector<uint8_t> &script_data =
      locking_script.GetData().GetBytes();
  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data =
      confidential_value.GetData().GetBytes();
  const std::vector<uint8_t> &nonce_data = nonce.GetData().GetBytes();
  const std::vector<uint8_t> &surjection_data = surjection_proof.GetBytes();
  const std::vector<uint8_t> &range_data = range_proof.GetBytes();

  int ret = wally_tx_add_elements_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), script_data.data(),
      script_data.size(), asset_data.data(), asset_data.size(),
      value_data.data(), value_data.size(),
      (nonce_data.size() == 0) ? nullptr : nonce_data.data(),
      nonce_data.size(),
      (surjection_data.size() == 0) ? nullptr : surjection_data.data(),
      surjection_data.size(),
      (range_data.size() == 0) ? nullptr : range_data.data(),
      range_data.size(), 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_output NG[{}].", ret);
    warn(CFD_LOG_SOURCE, "script_data.size[{}].", script_data.size());
    warn(CFD_LOG_SOURCE, "asset_data.size[{}].", asset_data.size());
    warn(CFD_LOG_SOURCE, "value_data.size[{}].", value_data.size());
    warn(CFD_LOG_SOURCE, "nonce_data.size[{}].", nonce_data.size());
    warn(CFD_LOG_SOURCE, "surjection_data.size[{}].", surjection_data.size());
    warn(CFD_LOG_SOURCE, "range_data.size[{}].", range_data.size());
    throw CfdException(kCfdIllegalStateError, "vout add error.");
  }

  ConfidentialTxOut out(
      locking_script, asset, confidential_value, nonce, surjection_proof,
      range_proof);
  out.SetValue(value);
  vout_.push_back(out);
  return static_cast<uint32_t>(vout_.size() - 1);
}